

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O3

BinomialNode * binomial_heap_top(BiHeap h)

{
  BinomialNode *pBVar1;
  BinomialNode *pBVar2;
  Type TVar3;
  
  pBVar1 = h->head;
  if (pBVar1 == (BinomialNode *)0x0) {
    return (BinomialNode *)0x0;
  }
  pBVar2 = pBVar1->sibling;
  if (pBVar2 != (BinomialNode *)0x0) {
    TVar3 = pBVar1->key;
    do {
      if (pBVar2->key < TVar3) {
        TVar3 = pBVar2->key;
        pBVar1 = pBVar2;
      }
      pBVar2 = pBVar2->sibling;
    } while (pBVar2 != (_BinomialNode *)0x0);
  }
  return pBVar1;
}

Assistant:

BinomialNode *binomial_heap_top(BiHeap h) {
    BinomialNode *y = NULL;
    BinomialNode *x = h->head;
    if (x != NULL) {
        int min = x->key;
        y = x;
        x = x->sibling;
        // travelling the list of the root nodes to find the minimum node
        while (x != NULL) {
            if (x->key < min) {
                min = x->key;
                y = x;
            }
            x = x->sibling;
        }
    }
    return y;
}